

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

void slang::ast::SemanticFacts::populateTimeScale
               (optional<slang::TimeScale> *timeScale,Scope *scope,
               optional<slang::TimeScale> directiveTimeScale,optional<slang::SourceRange> unitsRange
               ,optional<slang::SourceRange> precisionRange)

{
  bool bVar1;
  optional<slang::TimeScale> oVar2;
  Symbol *pSVar3;
  TimeScale *pTVar4;
  TimeScale *pTVar5;
  Diagnostic *arg;
  undefined8 in_RDX;
  SourceLocation in_RSI;
  Scope *in_stack_00000078;
  undefined1 in_stack_00000080 [16];
  Diagnostic *diag;
  SourceRange range;
  optional<slang::TimeScale> ts;
  optional<slang::TimeScale> *in_stack_ffffffffffffff40;
  Diagnostic *this;
  SourceRange *local_b8;
  Scope *in_stack_ffffffffffffff58;
  TimeScale *in_stack_ffffffffffffff60;
  TimeScaleValue *this_00;
  SourceLocation local_58;
  SourceLocation this_01;
  __unspec local_24;
  type local_23;
  _Storage<slang::TimeScale,_true> local_22;
  undefined1 local_1e;
  _Storage<slang::TimeScale,_true> local_1d;
  undefined1 local_19;
  SourceLocation local_18;
  _Storage<slang::TimeScale,_true> local_5;
  undefined1 local_1;
  
  this_00 = (TimeScaleValue *)&stack0x00000020;
  local_5 = SUB84(in_RDX,0);
  local_1 = (undefined1)((ulong)in_RDX >> 0x20);
  local_18 = in_RSI;
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a74f);
  if ((!bVar1) ||
     (bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a75f), !bVar1
     )) {
    std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x91a777);
    pSVar3 = Scope::asSymbol((Scope *)local_18);
    if (pSVar3->kind == CompilationUnit) {
      local_1d = local_5;
      local_19 = local_1;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x91a7b2);
    if (!bVar1) {
      oVar2 = Scope::getTimeScale(in_stack_ffffffffffffff58);
      local_22 = oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_payload;
      local_1e = oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_engaged;
      local_1d = local_22;
      local_19 = local_1e;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x91a800);
    if (bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x91a836);
      if (!bVar1) {
        std::optional<slang::TimeScale>::emplace<>(in_stack_ffffffffffffff40);
      }
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x91a811);
      if (!bVar1) {
        return;
      }
      std::optional<slang::TimeScale>::emplace<>(in_stack_ffffffffffffff40);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a853);
    if (!bVar1) {
      in_stack_ffffffffffffff60 =
           std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a864);
      pTVar4 = std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a876);
      pTVar4->base = in_stack_ffffffffffffff60->base;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a88b);
    if (!bVar1) {
      pTVar4 = std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a89c);
      pTVar5 = std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a8ae);
      pTVar5->precision = pTVar4->precision;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a8c5);
    if ((bVar1) ||
       (bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a8d3),
       bVar1)) {
      std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a8e9);
      std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a8ff);
      local_23 = (type)TimeScaleValue::operator<=>(this_00,&in_stack_ffffffffffffff60->base);
      std::__cmp_cat::__unspec::__unspec(&local_24,(__unspec *)0x0);
      bVar1 = std::operator>(local_23);
      if (bVar1) {
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x91a944);
        if (bVar1) {
          local_b8 = std::optional<slang::SourceRange>::operator*
                               ((optional<slang::SourceRange> *)0x91a954);
        }
        else {
          local_b8 = std::optional<slang::SourceRange>::operator*
                               ((optional<slang::SourceRange> *)0x91a965);
        }
        local_58 = local_b8->startLoc;
        this_01 = local_b8->endLoc;
        arg = Scope::addDiag(in_stack_00000078,(DiagCode)range.startLoc._4_4_,
                             (SourceRange)in_stack_00000080);
        std::optional<slang::TimeScale>::operator->((optional<slang::TimeScale> *)0x91a9d1);
        this = (Diagnostic *)&stack0xffffffffffffff88;
        TimeScale::toString_abi_cxx11_((TimeScale *)this_01);
        Diagnostic::operator<<(this,(string *)arg);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      }
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(std::optional<TimeScale>& timeScale, const Scope& scope,
                                      std::optional<TimeScale> directiveTimeScale,
                                      std::optional<SourceRange> unitsRange,
                                      std::optional<SourceRange> precisionRange) {
    // If no time unit was set, infer one based on the following rules:
    // - If the scope is nested (inside another definition), inherit from that definition.
    // - Otherwise use a `timescale directive if there is one.
    // - Otherwise, look for a time unit in the compilation scope.
    // - Finally use the compilation default.
    if (unitsRange && precisionRange)
        return;

    std::optional<TimeScale> ts;
    if (scope.asSymbol().kind == SymbolKind::CompilationUnit)
        ts = directiveTimeScale;

    if (!ts)
        ts = scope.getTimeScale();

    if (!ts) {
        // If the scope didn't have any portion of the timescale set yet,
        // then we'll just let it remain nullopt so clients know that we
        // are using the default. Otherwise we should use the built-in
        // default for the unset portion.
        if (!timeScale)
            return;

        // Defaults to 1ns/1ns
        ts.emplace();
    }
    else if (!timeScale) {
        timeScale.emplace();
    }

    if (!unitsRange)
        timeScale->base = ts->base;
    if (!precisionRange)
        timeScale->precision = ts->precision;

    if ((unitsRange || precisionRange) && timeScale->precision > timeScale->base) {
        auto range = precisionRange ? *precisionRange : *unitsRange;
        auto& diag = scope.addDiag(diag::InvalidInferredTimeScale, range);
        diag << timeScale->toString();
    }
}